

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugCompareHighsInfoInfeasibility
          (HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  HighsDebugStatus HVar2;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"num_primal_infeasibility",&local_e1);
  HVar1 = debugCompareHighsInfoInteger
                    (&local_40,options,
                     (highs_info0->super_HighsInfoStruct).num_primal_infeasibilities,
                     (highs_info1->super_HighsInfoStruct).num_primal_infeasibilities);
  HVar1 = debugWorseStatus(HVar1,kOk);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,"sum_primal_infeasibility",&local_e1);
  HVar2 = debugCompareHighsInfoDouble
                    (&local_60,options,
                     (highs_info0->super_HighsInfoStruct).sum_primal_infeasibilities,
                     (highs_info1->super_HighsInfoStruct).sum_primal_infeasibilities);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_80,"max_primal_infeasibility",&local_e1);
  HVar2 = debugCompareHighsInfoDouble
                    (&local_80,options,(highs_info0->super_HighsInfoStruct).max_primal_infeasibility
                     ,(highs_info1->super_HighsInfoStruct).max_primal_infeasibility);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"num_dual_infeasibility",&local_e1);
  HVar2 = debugCompareHighsInfoInteger
                    (&local_a0,options,(highs_info0->super_HighsInfoStruct).num_dual_infeasibilities
                     ,(highs_info1->super_HighsInfoStruct).num_dual_infeasibilities);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,"sum_dual_infeasibility",&local_e1);
  HVar2 = debugCompareHighsInfoDouble
                    (&local_c0,options,(highs_info0->super_HighsInfoStruct).sum_dual_infeasibilities
                     ,(highs_info1->super_HighsInfoStruct).sum_dual_infeasibilities);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0,"max_dual_infeasibility",&local_e1);
  HVar2 = debugCompareHighsInfoDouble
                    (&local_e0,options,(highs_info0->super_HighsInfoStruct).max_dual_infeasibility,
                     (highs_info1->super_HighsInfoStruct).max_dual_infeasibility);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  std::__cxx11::string::~string((string *)&local_e0);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoInfeasibility(
    const HighsOptions& options, const HighsInfo& highs_info0,
    const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_primal_infeasibility", options,
                                   highs_info0.num_primal_infeasibilities,
                                   highs_info1.num_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_primal_infeasibility", options,
                                  highs_info0.sum_primal_infeasibilities,
                                  highs_info1.sum_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_primal_infeasibility", options,
                                  highs_info0.max_primal_infeasibility,
                                  highs_info1.max_primal_infeasibility),
      return_status);

  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_dual_infeasibility", options,
                                   highs_info0.num_dual_infeasibilities,
                                   highs_info1.num_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_dual_infeasibility", options,
                                  highs_info0.sum_dual_infeasibilities,
                                  highs_info1.sum_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_dual_infeasibility", options,
                                  highs_info0.max_dual_infeasibility,
                                  highs_info1.max_dual_infeasibility),
      return_status);
  return return_status;
}